

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

float __thiscall Json::Value::asFloat(Value *this)

{
  ulong uVar1;
  float fVar2;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [376];
  
  switch(this->field_0x8) {
  case 1:
    fVar2 = (float)(this->value_).int_;
    break;
  case 2:
    uVar1 = (this->value_).int_;
    if ((long)uVar1 < 0) {
      fVar2 = (float)uVar1;
    }
    else {
      fVar2 = (float)(long)uVar1;
    }
    break;
  case 3:
    fVar2 = (float)(this->value_).real_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_180);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_180,"Value is not convertible to float.",0x22);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a0);
  case 5:
    if ((this->value_).bool_ != false) {
      return 1.0;
    }
  case 0:
    fVar2 = 0.0;
  }
  return fVar2;
}

Assistant:

float Value::asFloat() const {
  switch (type_) {
  case intValue:
    return static_cast<float>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<float>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    // This can fail (silently?) if the value is bigger than MAX_FLOAT.
    return static_cast<float>(integerToDouble(value_.uint_));
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return static_cast<float>(value_.real_);
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0f : 0.0f;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to float.");
}